

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

bool __thiscall
cmCommandArgumentParserHelper::HandleEscapeSymbol
          (cmCommandArgumentParserHelper *this,ParserType *pt,char symbol)

{
  ostream *poVar1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  char local_21;
  ParserType *pPStack_20;
  char symbol_local;
  ParserType *pt_local;
  cmCommandArgumentParserHelper *this_local;
  
  local_21 = symbol;
  pPStack_20 = pt;
  pt_local = (ParserType *)this;
  switch(symbol) {
  case ' ':
  case '\"':
  case '#':
  case '$':
  case '(':
  case ')':
  case '@':
  case '\\':
  case '^':
    AllocateParserType(this,pt,&local_21,1);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Invalid escape sequence \\");
    std::operator<<(poVar1,local_21);
    std::__cxx11::ostringstream::str();
    SetError(this,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    return false;
  case '0':
    AllocateParserType(this,pt,"",1);
    break;
  case ';':
    AllocateParserType(this,pt,"\\;",2);
    break;
  case 'n':
    AllocateParserType(this,pt,"\n",1);
    break;
  case 'r':
    AllocateParserType(this,pt,"\r",1);
    break;
  case 't':
    AllocateParserType(this,pt,"\t",1);
  }
  return true;
}

Assistant:

bool cmCommandArgumentParserHelper::HandleEscapeSymbol
(cmCommandArgumentParserHelper::ParserType* pt, char symbol)
{
  switch ( symbol )
    {
  case '\\':
  case '"':
  case ' ':
  case '#':
  case '(':
  case ')':
  case '$':
  case '@':
  case '^':
    this->AllocateParserType(pt, &symbol, 1);
    break;
  case ';':
    this->AllocateParserType(pt, "\\;", 2);
    break;
  case 't':
    this->AllocateParserType(pt, "\t", 1);
    break;
  case 'n':
    this->AllocateParserType(pt, "\n", 1);
    break;
  case 'r':
    this->AllocateParserType(pt, "\r", 1);
    break;
  case '0':
    this->AllocateParserType(pt, "\0", 1);
    break;
  default:
    {
    std::ostringstream e;
    e << "Invalid escape sequence \\" << symbol;
    this->SetError(e.str());
    }
    return false;
    }
  return true;
}